

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamToolsIndex::WriteReferenceEntry
          (BamToolsIndex *this,BtiReferenceEntry *refEntry)

{
  IBamIODevice *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  BamException *this_00;
  allocator local_5e;
  allocator local_5d;
  uint32_t numBlocks;
  string local_58;
  string local_38;
  
  numBlocks = (uint32_t)
              (((long)(refEntry->Blocks).
                      super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(refEntry->Blocks).
                     super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  if (this->m_isBigEndian == true) {
    numBlocks = numBlocks >> 0x18 | (numBlocks & 0xff0000) >> 8 | (numBlocks & 0xff00) << 8 |
                numBlocks << 0x18;
  }
  pIVar1 = (this->m_resources).Device;
  iVar2 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&numBlocks,4);
  if (CONCAT44(extraout_var,iVar2) == 4) {
    WriteBlocks(this,&refEntry->Blocks);
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_38,"BamToolsIndex::WriteReferenceEntry",&local_5d);
  std::__cxx11::string::string((string *)&local_58,"could not write number of blocks",&local_5e);
  BamException::BamException(this_00,&local_38,&local_58);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamToolsIndex::WriteReferenceEntry(const BtiReferenceEntry& refEntry) {

    // write number of blocks this reference
    uint32_t numBlocks = refEntry.Blocks.size();
    if ( m_isBigEndian ) SwapEndian_32(numBlocks);
    const int64_t numBytesWritten = m_resources.Device->Write((const char*)&numBlocks, sizeof(numBlocks));
    if ( numBytesWritten != sizeof(numBlocks) )
        throw BamException("BamToolsIndex::WriteReferenceEntry", "could not write number of blocks");

    // write actual block entries
    WriteBlocks(refEntry.Blocks);
}